

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::ValueExpressionBase::checkVariableAssignment
          (ValueExpressionBase *this,ASTContext *context,VariableSymbol *var,
          bitmask<slang::ast::AssignFlags> flags,SourceLocation assignLoc,SourceRange varRange)

{
  int *piVar1;
  Diagnostic *pDVar2;
  long lVar3;
  Expression *pEVar4;
  undefined4 in_register_0000000c;
  SourceLocation location;
  DiagCode DVar5;
  DiagCode code;
  SourceLocation in_R9;
  bool bVar6;
  SourceRange range;
  SourceRange range_00;
  
  location._4_4_ = in_register_0000000c;
  location._0_4_ = flags.m_bits;
  if (((ulong)context[2].instanceOrProc & 0x100000000) != 0) {
    lVar3 = *(long *)&this->super_Expression;
    if (lVar3 == 0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                );
    }
    while (piVar1 = *(int **)(lVar3 + 8), *piVar1 == 0x38) {
      lVar3 = *(long *)(piVar1 + 8);
      if (lVar3 == 0) {
        assert::assertFailed
                  ("parentScope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/MiscExpressions.cpp"
                   ,200,
                   "static bool slang::ast::ValueExpressionBase::checkVariableAssignment(const ASTContext &, const VariableSymbol &, bitmask<AssignFlags>, SourceLocation, SourceRange)"
                  );
      }
    }
    pEVar4 = DeclaredType::getInitializer((DeclaredType *)&context[1].lookupIndex);
    code.subsystem = Expressions;
    code.code = 0x17;
    if (((pEVar4 != (Expression *)0x0) || (*piVar1 != 0x3e)) ||
       ((*(byte *)(piVar1 + 0x2f) & 8) == 0)) goto LAB_003a0e0a;
  }
  if (((((ulong)var & 1) == 0) || (*(int *)&context[2].instanceOrProc != 0)) ||
     (code.subsystem = Expressions, code.code = 0x72, *(int *)&(context->scope).ptr == 0x3d)) {
    if (*(int *)&(context->scope).ptr == 0x51) {
      if (((ulong)var & 2) != 0) {
        if ((flags.m_bits & 0xfffffff) == 0) {
          location = assignLoc;
        }
        pDVar2 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x360007,location);
        Diagnostic::addNote(pDVar2,(DiagCode)0x40001,(SourceLocation)context->instanceOrProc);
        pDVar2 = Diagnostic::operator<<(pDVar2,*(string_view *)&context->lookupIndex);
        range.endLoc = in_R9;
        range.startLoc = assignLoc;
        Diagnostic::operator<<(pDVar2,range);
      }
      if (*(int *)&(context->scope).ptr != 0x51) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClockVarSymbol]")
        ;
      }
      bVar6 = *(int *)&context[2].firstTempVar == 0;
      DVar5.subsystem = Statements;
      DVar5.code = 0x4b;
      code.subsystem = Statements;
      code.code = 9;
      if (bVar6) {
        code = DVar5;
      }
      if (bVar6 || ((ulong)var & 1) == 0) goto LAB_003a0e0a;
    }
    code.subsystem = Expressions;
    code.code = 0x4f;
    if (((ulong)var & 0x10) == 0) {
      return true;
    }
  }
LAB_003a0e0a:
  if (((ulong)location & 0xfffffff) == 0) {
    location = assignLoc;
  }
  pDVar2 = ASTContext::addDiag((ASTContext *)this,code,location);
  Diagnostic::addNote(pDVar2,(DiagCode)0x40001,(SourceLocation)context->instanceOrProc);
  pDVar2 = Diagnostic::operator<<(pDVar2,*(string_view *)&context->lookupIndex);
  range_00.endLoc = in_R9;
  range_00.startLoc = assignLoc;
  Diagnostic::operator<<(pDVar2,range_00);
  return false;
}

Assistant:

bool ValueExpressionBase::checkVariableAssignment(const ASTContext& context,
                                                  const VariableSymbol& var,
                                                  bitmask<AssignFlags> flags,
                                                  SourceLocation assignLoc, SourceRange varRange) {
    auto reportErr = [&](DiagCode code) {
        if (!assignLoc)
            assignLoc = varRange.start();

        auto& diag = context.addDiag(code, assignLoc);
        diag.addNote(diag::NoteDeclarationHere, var.location);
        diag << var.name << varRange;
        return false;
    };

    if (var.flags.has(VariableFlags::Const)) {
        // If we are in a class constructor and this variable does not have an initializer,
        // it's ok to assign to it.
        const Symbol* parent = &context.scope->asSymbol();
        while (parent->kind == SymbolKind::StatementBlock) {
            auto parentScope = parent->getParentScope();
            ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (var.getInitializer() || parent->kind != SymbolKind::Subroutine ||
            (parent->as<SubroutineSymbol>().flags & MethodFlags::Constructor) == 0) {
            return reportErr(diag::AssignmentToConstVar);
        }
    }

    if (flags.has(AssignFlags::NonBlocking) && var.lifetime == VariableLifetime::Automatic &&
        var.kind != SymbolKind::ClassProperty) {
        return reportErr(diag::NonblockingAssignmentToAuto);
    }

    if (var.kind == SymbolKind::ClockVar) {
        if (flags.has(AssignFlags::InConcat))
            reportErr(diag::ClockVarAssignConcat);

        auto& cv = var.as<ClockVarSymbol>();
        if (cv.direction == ArgumentDirection::In)
            return reportErr(diag::WriteToInputClockVar);

        if (!flags.has(AssignFlags::NonBlocking))
            return reportErr(diag::ClockVarSyncDrive);
    }

    if (flags.has(AssignFlags::InOutPort))
        return reportErr(diag::InOutVarPortConn);

    return true;
}